

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O1

void tcmalloc::ThreadCache::DeleteCache(ThreadCache *heap)

{
  ThreadCache *pTVar1;
  bool bVar2;
  SpinLockHolder local_18;
  SpinLockHolder h;
  
  ~ThreadCache(heap);
  local_18.lock_ = (SpinLock *)(Static::pageheap_ + 8);
  LOCK();
  bVar2 = Static::pageheap_._8_4_ == 0;
  if (bVar2) {
    Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar2) {
    SpinLock::SlowLock((SpinLock *)(Static::pageheap_ + 8));
  }
  pTVar1 = heap->next_;
  if (pTVar1 != (ThreadCache *)0x0) {
    pTVar1->prev_ = heap->prev_;
  }
  if (heap->prev_ != (ThreadCache *)0x0) {
    heap->prev_->next_ = pTVar1;
  }
  if (thread_heaps_ == heap) {
    thread_heaps_ = heap->next_;
  }
  thread_heap_count_ = thread_heap_count_ + -1;
  if (next_memory_steal_ == heap) {
    next_memory_steal_ = heap->next_;
  }
  if (next_memory_steal_ == (ThreadCache *)0x0) {
    next_memory_steal_ = thread_heaps_;
  }
  unclaimed_cache_space_ = unclaimed_cache_space_ + heap->max_size_;
  heap->list_[0].list_ = (void *)threadcache_allocator._16_8_;
  threadcache_allocator._24_4_ = threadcache_allocator._24_4_ + -1;
  threadcache_allocator._16_8_ = heap;
  SpinLockHolder::~SpinLockHolder(&local_18);
  return;
}

Assistant:

void ThreadCache::DeleteCache(ThreadCache* heap) {
  // Remove all memory from heap
  heap->~ThreadCache();

  // Remove from linked list
  SpinLockHolder h(Static::pageheap_lock());
  if (heap->next_ != nullptr) heap->next_->prev_ = heap->prev_;
  if (heap->prev_ != nullptr) heap->prev_->next_ = heap->next_;
  if (thread_heaps_ == heap) thread_heaps_ = heap->next_;
  thread_heap_count_--;

  if (next_memory_steal_ == heap) next_memory_steal_ = heap->next_;
  if (next_memory_steal_ == nullptr) next_memory_steal_ = thread_heaps_;
  unclaimed_cache_space_ += heap->max_size_;

  threadcache_allocator.Delete(heap);
}